

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void mpt_frange(float *range,int len,float *val,int ld)

{
  float fVar1;
  float *pfStack_20;
  int ld_local;
  float *val_local;
  int len_local;
  float *range_local;
  
  if (len == 0) {
    range[1] = 0.0;
    *range = 0.0;
  }
  else {
    fVar1 = *val;
    range[1] = fVar1;
    *range = fVar1;
    pfStack_20 = val;
    val_local._4_4_ = len;
    if (ld != 0) {
      while (val_local._4_4_ = val_local._4_4_ + -1, 0 < val_local._4_4_) {
        pfStack_20 = pfStack_20 + ld;
        if (*pfStack_20 < *range) {
          *range = *pfStack_20;
        }
        if (range[1] <= *pfStack_20 && *pfStack_20 != range[1]) {
          range[1] = *pfStack_20;
        }
      }
    }
  }
  return;
}

Assistant:

extern void MPT_RANGE_FCN(MPT_RANGE_T range[2], int len, const MPT_RANGE_T *val, int ld)
{
	if (!len) {
#ifdef __cplusplus
		range[0] = range[1] = MPT_RANGE_T();
#else
		range[0] = range[1] = 0;
#endif
		return;
	}
	range[0] = range[1] = *val;
	
	if (!ld) {
		return;
	}
	while (--len > 0) {
		val += ld;
		if (*val < range[0]) {
			range[0] = *val;
		}
		if (*val > range[1]) {
			range[1] = *val;
		}
	}
}